

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O2

json read_json(path *root,string_view path)

{
  runtime_error *this;
  json_value extraout_RDX;
  json jVar1;
  path local_2b0;
  string_view path_local;
  path local_260;
  ifstream db_file;
  byte abStack_200 [488];
  
  path_local._M_len = (size_t)path._M_str;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            (&local_260,&path_local);
  std::experimental::filesystem::v1::__cxx11::operator/(&local_2b0,(path *)path._M_len,&local_260);
  std::ifstream::ifstream(&db_file,local_2b0._M_pathname._M_dataplus._M_p,_S_bin);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2b0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_260);
  if ((abStack_200[*(long *)(_db_file + -0x18)] & 5) == 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)root,(nullptr_t)0x0);
    nlohmann::operator>>
              ((istream *)&db_file,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)root);
    std::ifstream::~ifstream(&db_file);
    jVar1.m_value.object = extraout_RDX.object;
    jVar1._0_8_ = root;
    return jVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Failed to open database file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

json read_json(const fs::path &root, std::string_view path) {
    std::ifstream db_file(root / path, std::ifstream::binary);

    if (db_file.fail()) {
        throw std::runtime_error("Failed to open database file");
    }

    json db_json;

    try {
        db_file >> db_json;
    } catch (json::parse_error &e) {
        throw std::runtime_error("Failed to parse JSON");
    }
    return db_json;
}